

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int patternCompare(u8 *zPattern,u8 *zString,compareInfo *pInfo,u32 esc)

{
  byte bVar1;
  u8 uVar2;
  compareInfo *pInfo_00;
  bool bVar3;
  u32 uVar4;
  u32 uVar5;
  u32 uVar6;
  int iVar7;
  byte bVar8;
  bool bVar9;
  u8 *puVar10;
  u32 uVar11;
  byte *zString_00;
  bool bVar12;
  bool bVar13;
  u8 *local_58;
  byte *local_50;
  u32 local_44;
  u32 local_40;
  u32 local_3c;
  compareInfo *local_38;
  
  local_44 = (u32)pInfo->matchOne;
  bVar8 = pInfo->matchAll;
  bVar1 = pInfo->matchSet;
  uVar5 = (u32)bVar1;
  uVar2 = pInfo->noCase;
  local_58 = zPattern;
  local_50 = zString;
  local_38 = pInfo;
  uVar4 = sqlite3Utf8Read(&local_58);
  if (uVar4 != 0) {
    bVar13 = false;
    local_40 = (u32)bVar1;
    uVar11 = local_44;
    local_3c = esc;
    do {
      if (uVar4 == bVar8 && !bVar13) {
        uVar4 = sqlite3Utf8Read(&local_58);
        bVar13 = uVar4 == uVar11;
        if (uVar4 == bVar8 || bVar13) {
          do {
            if ((bVar13) && (uVar4 = sqlite3Utf8Read(&local_50), uVar4 == 0)) {
              return 0;
            }
            uVar4 = sqlite3Utf8Read(&local_58);
            bVar13 = uVar4 == local_44;
          } while (uVar4 == bVar8 || bVar13);
        }
        pInfo_00 = local_38;
        if (uVar4 == 0) {
          return 1;
        }
        if (uVar4 == esc) {
          uVar4 = sqlite3Utf8Read(&local_58);
          if (uVar4 == 0) {
            return 0;
          }
        }
        else if (uVar4 == uVar5) {
          bVar8 = *local_50;
          if (bVar8 == 0) {
            return 0;
          }
          puVar10 = local_58 + -1;
          zString_00 = local_50;
          do {
            iVar7 = patternCompare(puVar10,zString_00,local_38,esc);
            if (iVar7 != 0) {
              return 1;
            }
            if (bVar8 < 0xc0) {
              bVar8 = zString_00[1];
            }
            else {
              bVar8 = zString_00[1];
            }
            zString_00 = zString_00 + 1;
          } while (bVar8 != 0);
          return (uint)(iVar7 != 0);
        }
        puVar10 = local_58;
        do {
          uVar5 = sqlite3Utf8Read(&local_50);
          if (uVar5 == 0) {
            return 0;
          }
          if (uVar2 == '\0') {
            if (uVar5 != uVar4) {
              do {
                uVar5 = sqlite3Utf8Read(&local_50);
                if (uVar5 == 0) break;
              } while (uVar5 != uVar4);
              goto LAB_00123e07;
            }
          }
          else {
            if (uVar5 < 0x80) {
              uVar5 = (u32)""[uVar5];
            }
            if (uVar4 < 0x80) {
              uVar4 = (u32)""[uVar4];
            }
            while ((uVar5 != 0 && (uVar5 != uVar4))) {
              uVar5 = sqlite3Utf8Read(&local_50);
              if (uVar5 < 0x80) {
                uVar5 = (u32)""[uVar5];
              }
            }
LAB_00123e07:
            if (uVar5 == 0) {
              return 0;
            }
          }
          iVar7 = patternCompare(puVar10,local_50,pInfo_00,esc);
          if (iVar7 != 0) {
            return 1;
          }
        } while( true );
      }
      if (uVar4 == uVar11 && !bVar13) {
        uVar4 = sqlite3Utf8Read(&local_50);
        bVar13 = false;
        if (uVar4 == 0) {
          return 0;
        }
      }
      else {
        if (uVar4 == uVar5) {
          uVar5 = sqlite3Utf8Read(&local_50);
          if (uVar5 == 0) {
            return 0;
          }
          uVar4 = sqlite3Utf8Read(&local_58);
          bVar12 = uVar4 == 0x5e;
          if (bVar12) {
            uVar4 = sqlite3Utf8Read(&local_58);
          }
          bVar9 = false;
          uVar11 = 0;
          if (uVar4 != 0x5d) goto LAB_00123bfa;
          bVar9 = uVar5 == 0x5d;
LAB_00123beb:
          uVar11 = 0;
LAB_00123bed:
          uVar4 = sqlite3Utf8Read(&local_58);
LAB_00123bfa:
          if (uVar4 == 0x2d) {
            if ((*local_58 != ']') && (uVar11 != 0 && *local_58 != '\0')) goto code_r0x00123c59;
          }
          else {
            if (uVar4 == 0x5d) {
              esc = local_3c;
              uVar11 = local_44;
              uVar5 = local_40;
              if (bVar9 == bVar12) {
                return 0;
              }
              goto LAB_00123c25;
            }
            if (uVar4 == 0) {
              return 0;
            }
          }
          uVar11 = uVar4;
          if (uVar5 == uVar4) {
            bVar9 = true;
          }
          goto LAB_00123bed;
        }
        bVar12 = uVar4 != esc || bVar13;
        bVar13 = true;
        if (bVar12) {
          uVar6 = sqlite3Utf8Read(&local_50);
          if (uVar2 != '\0') {
            if (uVar4 < 0x80) {
              uVar4 = (u32)""[uVar4];
            }
            if (uVar6 < 0x80) {
              uVar6 = (u32)""[uVar6];
            }
          }
          bVar13 = false;
          if (uVar4 != uVar6) {
            return 0;
          }
        }
      }
LAB_00123c25:
      uVar4 = sqlite3Utf8Read(&local_58);
      zString = local_50;
    } while (uVar4 != 0);
  }
  return (uint)(*zString == 0);
code_r0x00123c59:
  uVar4 = sqlite3Utf8Read(&local_58);
  bVar3 = true;
  if (uVar4 < uVar5) {
    bVar3 = bVar9;
  }
  if (uVar11 <= uVar5) {
    bVar9 = bVar3;
  }
  goto LAB_00123beb;
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const struct compareInfo *pInfo, /* Information about how to do the compare */
  u32 esc                          /* The escape character */
){
  u32 c, c2;
  int invert;
  int seen;
  u8 matchOne = pInfo->matchOne;
  u8 matchAll = pInfo->matchAll;
  u8 matchSet = pInfo->matchSet;
  u8 noCase = pInfo->noCase; 
  int prevEscape = 0;     /* True if the previous character was 'escape' */

  while( (c = sqlite3Utf8Read(&zPattern))!=0 ){
    if( c==matchAll && !prevEscape ){
      while( (c=sqlite3Utf8Read(&zPattern)) == matchAll
               || c == matchOne ){
        if( c==matchOne && sqlite3Utf8Read(&zString)==0 ){
          return 0;
        }
      }
      if( c==0 ){
        return 1;
      }else if( c==esc ){
        c = sqlite3Utf8Read(&zPattern);
        if( c==0 ){
          return 0;
        }
      }else if( c==matchSet ){
        assert( esc==0 );         /* This is GLOB, not LIKE */
        assert( matchSet<0x80 );  /* '[' is a single-byte character */
        while( *zString && patternCompare(&zPattern[-1],zString,pInfo,esc)==0 ){
          SQLITE_SKIP_UTF8(zString);
        }
        return *zString!=0;
      }
      while( (c2 = sqlite3Utf8Read(&zString))!=0 ){
        if( noCase ){
          GlogUpperToLower(c2);
          GlogUpperToLower(c);
          while( c2 != 0 && c2 != c ){
            c2 = sqlite3Utf8Read(&zString);
            GlogUpperToLower(c2);
          }
        }else{
          while( c2 != 0 && c2 != c ){
            c2 = sqlite3Utf8Read(&zString);
          }
        }
        if( c2==0 ) return 0;
        if( patternCompare(zPattern,zString,pInfo,esc) ) return 1;
      }
      return 0;
    }else if( c==matchOne && !prevEscape ){
      if( sqlite3Utf8Read(&zString)==0 ){
        return 0;
      }
    }else if( c==matchSet ){
      u32 prior_c = 0;
      assert( esc==0 );    /* This only occurs for GLOB, not LIKE */
      seen = 0;
      invert = 0;
      c = sqlite3Utf8Read(&zString);
      if( c==0 ) return 0;
      c2 = sqlite3Utf8Read(&zPattern);
      if( c2=='^' ){
        invert = 1;
        c2 = sqlite3Utf8Read(&zPattern);
      }
      if( c2==']' ){
        if( c==']' ) seen = 1;
        c2 = sqlite3Utf8Read(&zPattern);
      }
      while( c2 && c2!=']' ){
        if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
          c2 = sqlite3Utf8Read(&zPattern);
          if( c>=prior_c && c<=c2 ) seen = 1;
          prior_c = 0;
        }else{
          if( c==c2 ){
            seen = 1;
          }
          prior_c = c2;
        }
        c2 = sqlite3Utf8Read(&zPattern);
      }
      if( c2==0 || (seen ^ invert)==0 ){
        return 0;
      }
    }else if( esc==c && !prevEscape ){
      prevEscape = 1;
    }else{
      c2 = sqlite3Utf8Read(&zString);
      if( noCase ){
        GlogUpperToLower(c);
        GlogUpperToLower(c2);
      }
      if( c!=c2 ){
        return 0;
      }
      prevEscape = 0;
    }
  }
  return *zString==0;
}